

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  string *psVar1;
  int iVar2;
  FieldDescriptor *pFVar3;
  undefined1 in_CL;
  string local_40;
  
  this->descriptor_ = descriptor;
  (this->type_traits_)._M_dataplus._M_p = (pointer)&(this->type_traits_).field_2;
  (this->type_traits_)._M_string_length = 0;
  psVar1 = &this->type_traits_;
  (this->type_traits_).field_2._M_local_buf[0] = '\0';
  Options::Options(&this->options_,options);
  pFVar3 = this->descriptor_;
  if (*(int *)(pFVar3 + 0x30) == 3) {
    std::__cxx11::string::assign((char *)psVar1);
    pFVar3 = this->descriptor_;
  }
  iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar3 + 0x2c) * 4);
  if (iVar2 == 10) {
    std::__cxx11::string::append((char *)psVar1);
    ClassName_abi_cxx11_
              (&local_40,*(cxx **)(this->descriptor_ + 0x48),(Descriptor *)0x1,(bool)in_CL);
    std::__cxx11::string::append((string *)psVar1);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else if (iVar2 != 9) {
    if (iVar2 == 8) {
      std::__cxx11::string::append((char *)psVar1);
      ClassName_abi_cxx11_
                (&local_40,*(cxx **)(this->descriptor_ + 0x50),(EnumDescriptor *)0x1,(bool)in_CL);
      std::__cxx11::string::append((string *)psVar1);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::append((char *)psVar1);
      ClassName_abi_cxx11_
                (&local_40,*(cxx **)(this->descriptor_ + 0x50),(EnumDescriptor *)0x1,(bool)in_CL);
      std::__cxx11::string::append((string *)psVar1);
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      std::__cxx11::string::append((char *)psVar1);
      PrimitiveTypeName(*(CppType *)
                         (FieldDescriptor::kTypeToCppTypeMap +
                         (ulong)*(uint *)(this->descriptor_ + 0x2c) * 4));
      std::__cxx11::string::append((char *)psVar1);
    }
  }
  std::__cxx11::string::append((char *)psVar1);
  return;
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const FieldDescriptor* descriptor,
                                       const Options& options)
  : descriptor_(descriptor),
    options_(options) {
  // Construct type_traits_.
  if (descriptor_->is_repeated()) {
    type_traits_ = "Repeated";
  }

  switch (descriptor_->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      type_traits_.append("EnumTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append(", ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append("_IsValid>");
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      type_traits_.append("StringTypeTraits");
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      type_traits_.append("MessageTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->message_type(), true));
      type_traits_.append(" >");
      break;
    default:
      type_traits_.append("PrimitiveTypeTraits< ");
      type_traits_.append(PrimitiveTypeName(descriptor_->cpp_type()));
      type_traits_.append(" >");
      break;
  }
}